

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_or_reference.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  CAR local_88;
  CAR local_68;
  allocator local_31;
  undefined1 local_30 [8];
  CAR myCar;
  
  myCar._28_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"blue",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  CAR::CAR(&local_88,(CAR *)local_30);
  setRed(&local_68,&local_88);
  CAR::operator=(local_30,&local_68);
  CAR::~CAR(&local_68);
  CAR::~CAR(&local_88);
  poVar1 = std::operator<<((ostream *)&std::cout,"myCar color : ");
  poVar1 = std::operator<<(poVar1,(string *)local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  myCar._28_4_ = 0;
  CAR::~CAR(local_30);
  return myCar._28_4_;
}

Assistant:

int main()
{
    CAR myCar = { "blue" };
    myCar = setRed(myCar);
    std::cout << "myCar color : " << myCar.color << std::endl;

    return 0;
}